

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

FString ExtractFileBase(char *path,bool include_extension)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  char in_DL;
  size_t len;
  undefined7 in_register_00000031;
  char *__s;
  
  __s = (char *)CONCAT71(in_register_00000031,include_extension);
  sVar3 = strlen(__s);
  if (__s + (sVar3 - 1) < __s) {
    path[0] = -0x44;
    path[1] = '}';
    path[2] = 'r';
    path[3] = '\0';
    path[4] = '\0';
    path[5] = '\0';
    path[6] = '\0';
    path[7] = '\0';
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
  }
  else {
    do {
      if (sVar3 == 1) goto LAB_0035af0b;
      sVar1 = sVar3 - 1;
      lVar2 = sVar3 - 2;
      sVar3 = sVar1;
    } while (__s[lVar2] != '/');
    __s = __s + sVar1;
LAB_0035af0b:
    if (in_DL == '\0') {
      for (len = 0; (__s[len] != '\0' && (__s[len] != '.')); len = len + 1) {
      }
      FString::FString((FString *)path,__s,len);
    }
    else {
      FString::FString((FString *)path,__s);
    }
  }
  return (FString)path;
}

Assistant:

FString ExtractFileBase (const char *path, bool include_extension)
{
	const char *src, *dot;

	src = path + strlen(path) - 1;

	if (src >= path)
	{
		// back up until a / or the start
		while (src != path && !IsSeperator(*(src-1)))
			src--;

		// Check for files with drive specification but no path
#if defined(_WIN32) || defined(DOS)
		if (src == path && src[0] != 0)
		{
			if (src[1] == ':')
				src += 2;
		}
#endif

		if (!include_extension)
		{
			dot = src;
			while (*dot && *dot != '.')
			{
				dot++;
			}
			return FString(src, dot - src);
		}
		else
		{
			return FString(src);
		}
	}
	return FString();
}